

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
authored(TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this)

{
  if ((((this->_attrib).has_value_ == false) &&
      ((this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) && (this->_value_empty == false)) {
    return this->_blocked;
  }
  return true;
}

Assistant:

bool authored() const {
    if (_attrib) {
      return true;
    }

    if (has_connections()) {
      return true;
    }

    if (_value_empty) {
      // Declare only.
      return true;
    }

    if (_blocked) {
      return true;
    }

    return false;
  }